

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzer.cpp
# Opt level: O3

void __thiscall I2cAnalyzer::RecordStartStopBit(I2cAnalyzer *this)

{
  I2cAnalyzerResults *pIVar1;
  int iVar2;
  MarkerType MVar3;
  ulonglong uVar4;
  FrameV2 framev2;
  FrameV2 aFStack_28 [8];
  
  iVar2 = AnalyzerChannelData::GetBitState();
  pIVar1 = (this->mResults)._M_ptr;
  MVar3 = AnalyzerChannelData::GetSampleNumber();
  if (iVar2 == 0) {
    AnalyzerResults::AddMarker((ulonglong)pIVar1,MVar3,(Channel *)0x8);
    FrameV2::FrameV2(aFStack_28);
    pIVar1 = (this->mResults)._M_ptr;
    uVar4 = AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerResults::AddFrameV2((FrameV2 *)pIVar1,(char *)aFStack_28,0x10902c,uVar4);
    FrameV2::~FrameV2(aFStack_28);
  }
  else {
    AnalyzerResults::AddMarker((ulonglong)pIVar1,MVar3,(Channel *)0x9);
  }
  this->mNeedAddress = true;
  AnalyzerResults::CommitPacketAndStartNewPacket();
  AnalyzerResults::CommitResults();
  if (iVar2 != 0) {
    FrameV2::FrameV2(aFStack_28);
    pIVar1 = (this->mResults)._M_ptr;
    uVar4 = AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerResults::AddFrameV2((FrameV2 *)pIVar1,(char *)aFStack_28,0x109032,uVar4);
    FrameV2::~FrameV2(aFStack_28);
  }
  return;
}

Assistant:

void I2cAnalyzer::RecordStartStopBit()
{
    bool start = mSda->GetBitState() == BIT_LOW;
    if( start )
    {
        // negedge -> START / restart
        mResults->AddMarker( mSda->GetSampleNumber(), AnalyzerResults::Start, mSettings->mSdaChannel );

        FrameV2 framev2;
        mResults->AddFrameV2( framev2, "start", mSda->GetSampleNumber(), mSda->GetSampleNumber() + 1 );
    }
    else
    {
        // posedge -> STOP
        mResults->AddMarker( mSda->GetSampleNumber(), AnalyzerResults::Stop, mSettings->mSdaChannel );
    }

    mNeedAddress = true;
    mResults->CommitPacketAndStartNewPacket();
    mResults->CommitResults();

    if( !start )
    {
        FrameV2 framev2;
        mResults->AddFrameV2( framev2, "stop", mSda->GetSampleNumber(), mSda->GetSampleNumber() + 1 );
    }
}